

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O1

uint64_t murmurhash(void *key,uint64_t len,uint64_t seed)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = len * -0x395b586ca42e166b ^ seed;
  pbVar1 = (byte *)key;
  for (uVar3 = len & 0xfffffffffffffff8; uVar3 != 0; uVar3 = uVar3 - 8) {
    uVar2 = (((ulong)(*(long *)pbVar1 * -0x395b586ca42e166b) >> 0x2f ^
             *(long *)pbVar1 * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ uVar2) *
            -0x395b586ca42e166b;
    pbVar1 = pbVar1 + 8;
  }
  if ((len & 7) != 0) {
    uVar3 = 0;
    for (; pbVar1 != (byte *)((long)key + (len & 7) + (len & 0xfffffffffffffff8));
        pbVar1 = pbVar1 + 1) {
      uVar3 = uVar3 << 8 | (ulong)*pbVar1;
    }
    uVar2 = (uVar3 ^ uVar2) * -0x395b586ca42e166b;
  }
  uVar2 = (uVar2 >> 0x2f ^ uVar2) * -0x395b586ca42e166b;
  return uVar2 >> 0x2f ^ uVar2;
}

Assistant:

inline uint64_t murmurhash(const void *key, uint64_t len, uint64_t seed) noexcept
{
    const uint64_t m = 0xc6a4a7935bd1e995ULL;
    const int r = 47;

    uint64_t h = seed ^ (len * m);

    const unsigned char *data = reinterpret_cast<const unsigned char *>(key);
    const unsigned char *end = data + (len & ~7ul);

    while (data != end) {
        uint64_t k;
        memcpy(&k, data, sizeof(uint64_t));

        k *= m;
        k ^= k >> r;
        k *= m;

        h ^= k;
        h *= m;

        data += 8;
    }

    len &= 7;
    if (len) {
        // handle the last few bytes of input
        size_t k = 0;
        end += len;

        while (data != end) {
            k <<= 8;
            k |= *data;
            ++data;
        }
        h ^= k;
        h *= m;
    }

    h ^= h >> r;
    h *= m;
    h ^= h >> r;

    return h;
}